

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.cc
# Opt level: O0

void __thiscall assembler::SessionPDU::skipLines(SessionPDU *this,int skip)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  const_iterator __position;
  size_type sVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  int in_ESI;
  long in_RDI;
  int i;
  size_type bytes;
  int columns;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff38;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff40;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff48;
  value_type *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  const_iterator in_stack_ffffffffffffff78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int iVar2;
  iterator in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 local_c;
  
  std::unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>::operator->
            ((unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_> *)0x1353df);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 8));
  local_c = in_ESI;
  if (sVar1 == *(uint *)(in_RDI + 0x68)) {
    in_stack_ffffffffffffff40 =
         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)(in_RDI + 8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_ffffffffffffff38);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              (in_stack_ffffffffffffff40,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff9f = 0;
    in_stack_ffffffffffffff90 =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                   (in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,in_stack_ffffffffffffff68,
                    in_stack_ffffffffffffff60);
    *(int *)(in_RDI + 0xa8) = *(int *)(in_RDI + 0xa8) + 1;
    local_c = in_ESI + -1;
  }
  for (iVar2 = 0; iVar2 < local_c; iVar2 = iVar2 + 1) {
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_00);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              (in_stack_ffffffffffffff40,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_00);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator-(in_stack_ffffffffffffff48,(difference_type)in_stack_ffffffffffffff40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_00);
    __position._M_current._7_1_ = in_stack_ffffffffffffff9f;
    __position._M_current._0_7_ = in_stack_ffffffffffffff98;
    __last._M_current._4_4_ = iVar2;
    __last._M_current._0_4_ = in_stack_ffffffffffffff88;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (in_stack_ffffffffffffff80,__position,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )in_stack_ffffffffffffff90._M_current,__last);
    *(int *)(in_RDI + 0xa8) = *(int *)(in_RDI + 0xa8) + 1;
  }
  return;
}

Assistant:

void SessionPDU::skipLines(int skip) {
  auto columns = szParam_->pixels_per_scanline;

  // The header must be complete or this function would not be called,
  // so the number of bytes in excess of the header must be greater
  // than or equal to 0.
  auto bytes = buf_.size() - ph_.totalHeaderLength;
  ASSERT(bytes >= 0);

  // Insert black line if there is no contents yet
  if (bytes == 0) {
    buf_.insert(buf_.end(), columns, 0);
    linesDone_++;
    skip--;
  }

  // Insert copies of the most recent line
  for (auto i = 0; i < skip; i++) {
    buf_.insert(buf_.end(), buf_.end() - columns, buf_.end());
    linesDone_++;
  }
}